

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

uint64_t __thiscall nuraft::buffer_serializer::get_u64(buffer_serializer *this)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  overflow_error *this_00;
  ulong uVar5;
  
  bVar2 = is_valid(this,8);
  if (bVar2) {
    pbVar3 = buffer::data_begin(this->buf_);
    pbVar4 = pbVar3 + this->pos_;
    if (this->endian_ == LITTLE) {
      uVar5 = (ulong)((uint)pbVar4[1] << 8 | (uint)pbVar4[2] << 0x10) |
              ((ulong)pbVar4[3] |
              (ulong)pbVar4[4] << 8 |
              (ulong)pbVar4[5] << 0x10 | (ulong)*(ushort *)(pbVar4 + 6) << 0x18) << 0x18;
    }
    else {
      uVar5 = ((ulong)(ushort)(*(ushort *)(pbVar4 + 5) << 8 | *(ushort *)(pbVar4 + 5) >> 8) |
              CONCAT44((uint)pbVar4[2] | (uint)pbVar4[1] << 8 | (uint)*pbVar4 << 0x10,
                       (uint)pbVar4[4] << 0x10 | (uint)pbVar4[3] << 0x18)) << 8;
      pbVar4 = pbVar4 + 7;
    }
    bVar1 = *pbVar4;
    pos(this,this->pos_ + 8);
    return bVar1 | uVar5;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

uint64_t buffer_serializer::get_u64() {
    uint64_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get64l(ptr, ret); }
    else                    { get64b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}